

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgCong.cpp
# Opt level: O2

ClauseIterator __thiscall Inferences::ArgCong::generateClauses(ArgCong *this,Clause *premise)

{
  ulong uVar1;
  undefined8 uVar2;
  uint uVar3;
  long lVar4;
  Clause *in_RDX;
  FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::ArgCong::IsPositiveEqualityFn,_false>,_Inferences::ArgCong::ResultFn,_Kernel::Clause_*>,_Lib::NonzeroFn,_false>
  local_70;
  
  uVar1 = *(ulong *)&in_RDX->field_0x38;
  if ((uVar1 & 0xfffff) == 0) {
    Lib::VirtualIterator<Kernel::Clause_*>::getEmpty();
  }
  else {
    lVar4 = (**(code **)(*(long *)&premise->super_Unit + 0x20))(premise);
    if (*(char *)(lVar4 + 0x1502) == '\x01') {
      (**(code **)(**(long **)(*(long *)&(premise->super_Unit)._inference + 200) + 0x10))();
    }
    uVar2 = *(undefined8 *)&in_RDX->field_0x38;
    uVar3 = Kernel::Clause::maxVar(in_RDX);
    local_70._inn._func._8_8_ = CONCAT44(uVar3 + 1,(int)uVar2) & 0xffffffff000fffff;
    local_70._inn._inner._inn._iter._inner._next = 0;
    local_70._inn._inner._inn._iter._inner._from = 0;
    local_70._inn._inner._next.super_OptionBase<Kernel::Literal_*&>.
    super_OptionBaseRef<Kernel::Literal_**>._elem =
         (OptionBase<Kernel::Literal_*&>)(OptionBaseRef<Kernel::Literal_**>)0x0;
    local_70._next.super_OptionBase<Kernel::Clause_*>._isSome = false;
    local_70._inn._inner._inn._iter._inner._to = (uint)(uVar1 >> 0x20) & 0xfffff;
    Lib::
    pvi<Lib::FilteredIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::ArgCong::IsPositiveEqualityFn,false>,Inferences::ArgCong::ResultFn,Kernel::Clause*>,Lib::NonzeroFn,false>>
              ((Lib *)this,&local_70);
  }
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

ClauseIterator ArgCong::generateClauses(Clause* premise)
{
  //cout << "argcong with " + premise->toString() << endl;
  if(premise->isEmpty()) {
    return ClauseIterator::getEmpty();
  }
  ASS(premise->numSelected()>0);

  auto it1 = premise->getSelectedLiteralIterator();

  auto it2 = getFilteredIterator(it1,IsPositiveEqualityFn());

  auto it3 = getMappingIterator(it2,ResultFn(premise,
      getOptions().literalMaximalityAftercheck() && _salg->getLiteralSelector().isBGComplete(),
      &_salg->getOrdering()));

  auto it4 = getFilteredIterator(it3,NonzeroFn());

  //cout << "out of arg cong" << endl;
  return pvi( it4 );
}